

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader.c
# Opt level: O1

loader_impl_interface mock_loader_impl_interface_singleton(void)

{
  return &mock_loader_impl_interface_singleton::loader_impl_interface_mock;
}

Assistant:

loader_impl_interface mock_loader_impl_interface_singleton(void)
{
	static struct loader_impl_interface_type loader_impl_interface_mock = {
		&mock_loader_impl_initialize,
		&mock_loader_impl_execution_path,
		&mock_loader_impl_load_from_file,
		&mock_loader_impl_load_from_memory,
		&mock_loader_impl_load_from_package,
		&mock_loader_impl_clear,
		&mock_loader_impl_discover,
		&mock_loader_impl_destroy
	};

	return &loader_impl_interface_mock;
}